

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O1

void __thiscall scheduler_tests::mockforward::test_method(mockforward *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  Function f;
  Function f_00;
  Function f_01;
  Function f_02;
  time_point tVar3;
  long lVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar7;
  undefined8 in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  _Manager_type in_stack_fffffffffffffd38;
  _Invoker_type in_stack_fffffffffffffd40;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  thread local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  CScheduler *local_258;
  undefined8 uStack_250;
  code *local_248;
  code *pcStack_240;
  thread scheduler_thread;
  undefined1 local_230 [16];
  undefined1 *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  size_t num_tasks;
  time_point last;
  time_point first;
  _Any_data local_1d8;
  code *local_1c8;
  _Any_data local_1b8;
  code *local_1a8;
  _Any_data local_198;
  code *local_188;
  Function dummy;
  int counter;
  thread *local_148;
  assertion_result local_140;
  thread **local_128;
  size_t *local_120;
  lazy_ostream local_118;
  undefined1 *local_108;
  lazy_ostream *local_100;
  char *local_f8;
  char *local_f0;
  assertion_result local_e8;
  CScheduler scheduler;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScheduler::CScheduler(&scheduler);
  dummy.super__Function_base._M_functor._M_unused._M_object = &counter;
  counter = 0;
  dummy.super__Function_base._M_functor._8_8_ = 0;
  dummy._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp:179:34)>
       ::_M_invoke;
  dummy.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp:179:34)>
       ::_M_manager;
  std::function<void_()>::function((function<void_()> *)&local_198,&dummy);
  f.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd30;
  f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd28;
  f.super__Function_base._M_manager = in_stack_fffffffffffffd38;
  f._M_invoker = in_stack_fffffffffffffd40;
  CScheduler::scheduleFromNow(&scheduler,f,(milliseconds)&local_198);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  std::function<void_()>::function((function<void_()> *)&local_1b8,&dummy);
  f_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd30;
  f_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd28;
  f_00.super__Function_base._M_manager = in_stack_fffffffffffffd38;
  f_00._M_invoker = in_stack_fffffffffffffd40;
  CScheduler::scheduleFromNow(&scheduler,f_00,(milliseconds)&local_1b8);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  std::function<void_()>::function((function<void_()> *)&local_1d8,&dummy);
  f_01.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd30;
  f_01.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd28;
  f_01.super__Function_base._M_manager = in_stack_fffffffffffffd38;
  f_01._M_invoker = in_stack_fffffffffffffd40;
  CScheduler::scheduleFromNow(&scheduler,f_01,(milliseconds)&local_1d8);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  first.__d.__r = (duration)0;
  last.__d.__r = (duration)0;
  num_tasks = CScheduler::getQueueInfo(&scheduler,&first,&last);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xbe;
  file.m_begin = (iterator)&local_200;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_210,msg);
  local_230._8_8_ = local_230._8_8_ & 0xffffffffffffff00;
  local_230._0_8_ = &PTR__lazy_ostream_013abb30;
  local_220 = boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_148 = &scheduler_thread;
  scheduler_thread._M_id._M_thread = (id)3;
  local_120 = &num_tasks;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(num_tasks == 3);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_f0 = "";
  local_100 = (lazy_ostream *)&local_120;
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_013abb70;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_230,1,2,REQUIRE,0xec517a,(size_t)&local_f8,0xbe,
             &local_118,"3ul",&local_140);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  scheduler_thread._M_id._M_thread = (id)0;
  local_118._vptr_lazy_ostream = (_func_int **)operator_new(0x10);
  *local_118._vptr_lazy_ostream = (_func_int *)&PTR___State_013afa58;
  local_118._vptr_lazy_ostream[1] = (_func_int *)&scheduler;
  std::thread::_M_start_thread(&scheduler_thread,&local_118,0);
  if (local_118._vptr_lazy_ostream != (_func_int **)0x0) {
    (**(code **)(*local_118._vptr_lazy_ostream + 8))();
  }
  CScheduler::MockForward(&scheduler,(seconds)0x12c);
  uStack_250 = 0;
  pcStack_240 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp:198:31)>
                ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp:198:31)>
              ::_M_manager;
  f_02.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd30;
  f_02.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd28;
  f_02.super__Function_base._M_manager = in_stack_fffffffffffffd38;
  f_02._M_invoker = in_stack_fffffffffffffd40;
  local_258 = &scheduler;
  CScheduler::scheduleFromNow(&scheduler,f_02,(milliseconds)&local_258);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,3);
  }
  std::thread::join();
  num_tasks = CScheduler::getQueueInfo(&scheduler,&first,&last);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xcb;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  local_230._8_8_ = local_230._8_8_ & 0xffffffffffffff00;
  local_230._0_8_ = &PTR__lazy_ostream_013abb30;
  local_220 = boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(num_tasks == 1);
  local_280._M_id._M_thread = (id)1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_f0 = "";
  local_120 = &num_tasks;
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb70;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (lazy_ostream *)&local_120;
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_013abb70;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_148 = &local_280;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_230,1,2,REQUIRE,0xec517a,(size_t)&local_f8,0xcb,
             &local_118,"1ul",&local_140);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xce;
  file_01.m_begin = (iterator)&local_290;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a0,
             msg_01);
  local_230._8_8_ = local_230._8_8_ & 0xffffffffffffff00;
  local_230._0_8_ = &PTR__lazy_ostream_013abb30;
  local_220 = boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_280._M_id._M_thread._0_4_ = 2;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(counter == 2);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_f0 = "";
  local_120 = (size_t *)&counter;
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (lazy_ostream *)&local_120;
  local_140.m_message.px = (element_type *)((ulong)local_140.m_message.px & 0xffffffffffffff00);
  local_140._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_148 = &local_280;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)local_230,1,2,REQUIRE,0xec518c,(size_t)&local_f8,0xce,
             &local_118,"2",&local_140);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  lVar4 = std::chrono::_V2::steady_clock::now();
  tVar3 = first;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_2a8 = "";
  _cVar7 = 0x59f2e9;
  file_02.m_end = (iterator)0xd4;
  file_02.m_begin = (iterator)&local_2b0;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
             (size_t)&stack0xfffffffffffffd40,msg_02);
  auVar2 = SEXT816((long)tVar3.__d.__r - lVar4) * SEXT816(0x112e0be826d694b3);
  local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (((int)(auVar2._8_8_ >> 0x1a) - (auVar2._12_4_ >> 0x1f)) - 0x79U < 0x3b);
  local_140.m_message.px = (element_type *)0x0;
  local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230._0_8_ = "delta > 2*60 && delta < 3*60";
  local_230._8_8_ = "";
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = (lazy_ostream *)local_230;
  boost::test_tools::tt_detail::report_assertion
            (&local_140,&local_118,1,0,WARN,_cVar7,(size_t)&stack0xfffffffffffffd30,0xd4);
  boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
  if (scheduler_thread._M_id._M_thread == 0) {
    if (dummy.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*dummy.super__Function_base._M_manager)
                ((_Any_data *)&dummy,(_Any_data *)&dummy,__destroy_functor);
    }
    CScheduler::~CScheduler(&scheduler);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
    __stack_chk_fail();
  }
  std::terminate();
}

Assistant:

BOOST_AUTO_TEST_CASE(mockforward)
{
    CScheduler scheduler;

    int counter{0};
    CScheduler::Function dummy = [&counter]{counter++;};

    // schedule jobs for 2, 5 & 8 minutes into the future

    scheduler.scheduleFromNow(dummy, std::chrono::minutes{2});
    scheduler.scheduleFromNow(dummy, std::chrono::minutes{5});
    scheduler.scheduleFromNow(dummy, std::chrono::minutes{8});

    // check taskQueue
    std::chrono::steady_clock::time_point first, last;
    size_t num_tasks = scheduler.getQueueInfo(first, last);
    BOOST_CHECK_EQUAL(num_tasks, 3ul);

    std::thread scheduler_thread([&]() { scheduler.serviceQueue(); });

    // bump the scheduler forward 5 minutes
    scheduler.MockForward(std::chrono::minutes{5});

    // ensure scheduler has chance to process all tasks queued for before 1 ms from now.
    scheduler.scheduleFromNow([&scheduler] { scheduler.stop(); }, std::chrono::milliseconds{1});
    scheduler_thread.join();

    // check that the queue only has one job remaining
    num_tasks = scheduler.getQueueInfo(first, last);
    BOOST_CHECK_EQUAL(num_tasks, 1ul);

    // check that the dummy function actually ran
    BOOST_CHECK_EQUAL(counter, 2);

    // check that the time of the remaining job has been updated
    auto now = std::chrono::steady_clock::now();
    int delta = std::chrono::duration_cast<std::chrono::seconds>(first - now).count();
    // should be between 2 & 3 minutes from now
    BOOST_CHECK(delta > 2*60 && delta < 3*60);
}